

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

ProcessorInstanceRef * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::getOrCreateImplicitProcessorInstance
          (QualifiedIdentifierResolver *this,Context *c,ProcessorBase *processor,
          pool_ptr<soul::AST::Expression> *arguments)

{
  ModuleBase *pMVar1;
  pointer ppVar2;
  Expression *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Allocator *this_00;
  SharedEndpoint *pSVar4;
  undefined8 uVar5;
  QualifiedIdentifierResolver *pQVar6;
  Graph *this_01;
  pool_ptr<soul::AST::Expression> *ppVar7;
  int iVar8;
  ProcessorInstance *pPVar9;
  UnqualifiedName *pUVar10;
  ProcessorRef *pPVar11;
  ProcessorInstanceRef *pPVar12;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *pAVar13;
  Identifier *in_R9;
  pointer ppVar14;
  bool bVar15;
  string_view newString;
  string name;
  pool_ref<soul::AST::ProcessorInstance> i;
  string signature;
  undefined1 local_158 [56];
  undefined1 local_120 [32];
  QualifiedIdentifierResolver *local_100;
  Graph *local_f8;
  pool_ptr<soul::AST::Expression> *local_f0;
  ASTUtilities *local_e8;
  pool_ptr<soul::AST::Expression> local_e0;
  ProcessorBase *local_d8;
  pool_ref<soul::AST::ProcessorInstance> local_d0;
  string local_c8;
  pool_ptr<soul::AST::Expression> local_a8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_a8 = (pool_ptr<soul::AST::Expression>)arguments->object;
  pAVar13 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)arguments;
  AST::CommaSeparatedList::getAsExpressionList
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_158,
             &local_a8);
  local_e8 = (ASTUtilities *)&(processor->super_ModuleBase).specialisationParams;
  ASTUtilities::
  getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (&local_c8,local_e8,
             (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
              *)local_158,pAVar13);
  local_158._8_8_ = (pointer)0x0;
  if (((pointer)0x4 < (ulong)local_158._16_8_) &&
     ((pool_ref<soul::AST::Expression> *)local_158._0_8_ != (pool_ref<soul::AST::Expression> *)0x0))
  {
    operator_delete__((void *)local_158._0_8_);
  }
  pMVar1 = (this->currentModule).object;
  local_100 = this;
  local_f0 = arguments;
  if (pMVar1 != (ModuleBase *)0x0) {
    pAVar13 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)0x0;
    local_f8 = (Graph *)__dynamic_cast(pMVar1,&AST::ModuleBase::typeinfo,&AST::Graph::typeinfo);
    if (local_f8 != (Graph *)0x0) {
      ppVar14 = (local_f8->processorInstances).
                super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (local_f8->processorInstances).
               super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar14 != ppVar2) {
        do {
          pPVar9 = ppVar14->object;
          pEVar3 = (pPVar9->targetProcessor).object;
          local_d0.object = pPVar9;
          if (pEVar3 == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_d8);
          if (local_d8 == processor) {
            local_e0.object = (pPVar9->specialisationArgs).object;
            AST::CommaSeparatedList::getAsExpressionList
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                       local_158,&local_e0);
            ASTUtilities::
            getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
                      ((string *)local_120,local_e8,
                       (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                        *)local_158,pAVar13);
            uVar5 = local_120._0_8_;
            if (local_c8._M_string_length == local_120._8_8_) {
              if (local_c8._M_string_length == 0) {
                bVar15 = true;
              }
              else {
                iVar8 = bcmp(local_c8._M_dataplus._M_p,(void *)local_120._0_8_,
                             local_c8._M_string_length);
                bVar15 = iVar8 == 0;
              }
            }
            else {
              bVar15 = false;
            }
            if ((string *)uVar5 != (string *)(local_120 + 0x10)) {
              operator_delete((void *)uVar5,local_120._16_8_ + 1);
            }
            local_158._8_8_ = (pointer)0x0;
            if (((pointer)0x4 < (ulong)local_158._16_8_) &&
               ((pool_ref<soul::AST::Expression> *)local_158._0_8_ !=
                (pool_ref<soul::AST::Expression> *)0x0)) {
              operator_delete__((void *)local_158._0_8_);
            }
            if (bVar15) {
              pSVar4 = (pPVar9->implicitInstanceSource).object;
              if (pSVar4 == (SharedEndpoint *)0x0) {
                CompileMessageHelpers::createMessage<soul::Identifier&>
                          (&local_68,(CompileMessageHelpers *)0x1,none,0x27c2be,
                           (char *)&(processor->super_ModuleBase).name,in_R9);
                AST::Context::throwError(c,&local_68,false);
              }
              if (pSVar4 != (local_100->currentConnectionEndpoint).object) {
                CompileMessageHelpers::createMessage<>
                          (&local_a0,syntax,error,
                           "An implicitly-created processor cannot be used more than once: create a named instance instead"
                          );
                AST::Context::throwError(c,&local_a0,false);
              }
              pPVar12 = PoolAllocator::
                        allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorInstance>&>
                                  (&((local_100->super_ModuleInstanceResolver).
                                     super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,
                                   &local_d0);
              goto LAB_001ec365;
            }
          }
          ppVar14 = ppVar14 + 1;
        } while (ppVar14 != ppVar2);
      }
      pQVar6 = local_100;
      pPVar9 = PoolAllocator::allocate<soul::AST::ProcessorInstance,soul::AST::Context&>
                         (&((local_100->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c);
      ppVar7 = local_f0;
      this_01 = local_f8;
      if (local_f0->object == (Expression *)0x0) {
        pUVar10 = PoolAllocator::
                  allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                            (&((pQVar6->super_ModuleInstanceResolver).
                               super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,
                             &(processor->super_ModuleBase).name);
        (pPVar9->instanceName).object = pUVar10;
      }
      else {
        __rhs = (processor->super_ModuleBase).name.name;
        if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          throwInternalCompilerError("isValid()","toString",0x23);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,"_instance_",__rhs);
        AST::Scope::makeUniqueName
                  ((string *)local_158,&(this_01->super_ProcessorBase).super_ModuleBase.super_Scope,
                   (string *)local_120);
        if ((string *)local_120._0_8_ != (string *)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
        this_00 = (pQVar6->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                  allocator;
        newString._M_str = (char *)local_158._0_8_;
        newString._M_len = local_158._8_8_;
        local_120._0_8_ = Identifier::Pool::get(&this_00->identifiers,newString);
        pUVar10 = PoolAllocator::
                  allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                            (&this_00->pool,c,(Identifier *)local_120);
        (pPVar9->instanceName).object = pUVar10;
        if ((pool_ref<soul::AST::Expression> *)local_158._0_8_ !=
            (pool_ref<soul::AST::Expression> *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
      }
      pPVar11 = PoolAllocator::
                allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                          (&((pQVar6->super_ModuleInstanceResolver).
                             super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,processor);
      (pPVar9->targetProcessor).object = &pPVar11->super_Expression;
      (pPVar9->specialisationArgs).object = ppVar7->object;
      (pPVar9->implicitInstanceSource).object = (pQVar6->currentConnectionEndpoint).object;
      AST::Graph::addProcessorInstance(this_01,pPVar9);
      pPVar12 = PoolAllocator::
                allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                          (&((pQVar6->super_ModuleInstanceResolver).
                             super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,c,pPVar9);
LAB_001ec365:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      return pPVar12;
    }
  }
  throwInternalCompilerError("currentGraph != nullptr","getOrCreateImplicitProcessorInstance",0x409)
  ;
}

Assistant:

AST::ProcessorInstanceRef& getOrCreateImplicitProcessorInstance (AST::Context& c,
                                                                         AST::ProcessorBase& processor,
                                                                         pool_ptr<AST::Expression> arguments)
        {
            auto signature = ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                       AST::CommaSeparatedList::getAsExpressionList (arguments));

            auto currentGraph = cast<AST::Graph> (currentModule);
            SOUL_ASSERT (currentGraph != nullptr);

            for (auto i : currentGraph->processorInstances)
            {
                if (i->targetProcessor->getAsProcessor() == processor
                     && signature == ASTUtilities::getSpecialisationSignature (processor.specialisationParams,
                                                                               AST::CommaSeparatedList::getAsExpressionList (i->specialisationArgs)))
                {
                    if (i->implicitInstanceSource == nullptr)
                        c.throwError (Errors::cannotUseProcessorInLet (processor.name));

                    if (i->implicitInstanceSource != currentConnectionEndpoint)
                        c.throwError (Errors::cannotReuseImplicitProcessorInstance());

                    return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
                }
            }

            auto& i = allocator.allocate<AST::ProcessorInstance> (c);

            if (arguments == nullptr)
            {
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, processor.name);
            }
            else
            {
                auto name = currentGraph->makeUniqueName ("_instance_" + processor.name.toString());
                i.instanceName = allocator.allocate<AST::UnqualifiedName> (c, allocator.get (name));
            }

            i.targetProcessor = allocator.allocate<AST::ProcessorRef> (c, processor);
            i.specialisationArgs = arguments;
            i.implicitInstanceSource = currentConnectionEndpoint;
            currentGraph->addProcessorInstance (i);
            return allocator.allocate<AST::ProcessorInstanceRef> (c, i);
        }